

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iso_writer.cpp
# Opt level: O2

FileEntryInfo * __thiscall FileEntryInfo::fileByName(FileEntryInfo *this,string *name)

{
  pointer ppFVar1;
  __type _Var2;
  FileEntryInfo **i;
  pointer ppFVar3;
  
  ppFVar3 = (this->m_files).super__Vector_base<FileEntryInfo_*,_std::allocator<FileEntryInfo_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  ppFVar1 = (this->m_files).super__Vector_base<FileEntryInfo_*,_std::allocator<FileEntryInfo_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  while( true ) {
    if (ppFVar3 == ppFVar1) {
      return (FileEntryInfo *)0x0;
    }
    _Var2 = std::operator==(&(*ppFVar3)->m_name,name);
    if (_Var2) break;
    ppFVar3 = ppFVar3 + 1;
  }
  return *ppFVar3;
}

Assistant:

FileEntryInfo *FileEntryInfo::fileByName(const std::string &name) const
{
    for (auto &i : m_files)
    {
        if (i->m_name == name)
            return i;
    }
    return nullptr;
}